

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFlateDecodeTester.cpp
# Opt level: O2

int InputFlateDecodeTester(int argc,char **argv)

{
  IByteWriterWithPosition *inWriter;
  IByteReader *inSourceReader;
  LongBufferSizeType LVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  Byte buffer;
  allocator<char> local_141;
  string local_140;
  string aString;
  InputFile inputFile;
  string local_d0;
  OutputFlateEncodeStream outputEncoder;
  InputFlateDecodeStream inputDecoder;
  OutputFile outputFile;
  
  OutputFile::OutputFile(&outputFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aString,"hello world",(allocator<char> *)&inputFile);
  InputFlateDecodeStream::InputFlateDecodeStream(&inputDecoder);
  OutputFlateEncodeStream::OutputFlateEncodeStream(&outputEncoder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"source.txt",(allocator<char> *)&local_d0);
  BuildRelativeOutputPath(&inputFile.mFilePath,argv,&local_140);
  OutputFile::OpenFile(&outputFile,&inputFile.mFilePath,false);
  std::__cxx11::string::~string((string *)&inputFile);
  std::__cxx11::string::~string((string *)&local_140);
  inWriter = OutputFile::GetOutputStream(&outputFile);
  OutputFlateEncodeStream::Assign(&outputEncoder,inWriter,true);
  OutputFlateEncodeStream::Write
            (&outputEncoder,(Byte *)aString._M_dataplus._M_p,aString._M_string_length);
  OutputFlateEncodeStream::Assign(&outputEncoder,(IByteWriterWithPosition *)0x0,true);
  OutputFile::CloseFile(&outputFile);
  InputFile::InputFile(&inputFile);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"source.txt",&local_141);
  BuildRelativeOutputPath(&local_140,argv,&local_d0);
  InputFile::OpenFile(&inputFile,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_d0);
  inSourceReader = &InputFile::GetInputStream(&inputFile)->super_IByteReader;
  InputFlateDecodeStream::Assign(&inputDecoder,inSourceReader);
  bVar4 = true;
  _Var3 = aString._M_dataplus;
  while( true ) {
    if ((_Var3._M_p == aString._M_dataplus._M_p + aString._M_string_length) || (!bVar4))
    goto LAB_00132ebe;
    LVar1 = InputFlateDecodeStream::Read(&inputDecoder,&buffer,1);
    if (LVar1 != 1) break;
    bVar4 = (int)*_Var3._M_p == (uint)buffer;
    _Var3._M_p = _Var3._M_p + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Read failes. expected ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
  poVar2 = std::operator<<(poVar2," characters. Found");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  bVar4 = false;
LAB_00132ebe:
  InputFlateDecodeStream::Assign(&inputDecoder,(IByteReader *)0x0);
  InputFile::CloseFile(&inputFile);
  if (!bVar4) {
    std::operator<<((ostream *)&std::cout,"Read failes. different characters than what expected\n");
  }
  InputFile::~InputFile(&inputFile);
  OutputFlateEncodeStream::~OutputFlateEncodeStream(&outputEncoder);
  InputFlateDecodeStream::~InputFlateDecodeStream(&inputDecoder);
  std::__cxx11::string::~string((string *)&aString);
  OutputFile::~OutputFile(&outputFile);
  return (uint)!bVar4;
}

Assistant:

int InputFlateDecodeTester(int argc, char* argv[])
{
	OutputFile outputFile;
	string aString("hello world");
	IOBasicTypes::Byte buffer;
	InputFlateDecodeStream inputDecoder;
	OutputFlateEncodeStream outputEncoder;

	outputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	outputEncoder.Assign(outputFile.GetOutputStream());
	outputEncoder.Write((IOBasicTypes::Byte*)aString.c_str(),aString.size());
	outputEncoder.Assign(NULL);
	outputFile.CloseFile();

	InputFile inputFile;
	inputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	inputDecoder.Assign(inputFile.GetInputStream());

	bool isSame = true;
	int i=0;
	string::iterator it = aString.begin();

	for(; it != aString.end() && isSame;++it,++i)
	{
		LongBufferSizeType amountRead = inputDecoder.Read(&buffer,1);

		if(amountRead != 1)
		{
			cout<<"Read failes. expected "<<1<<" characters. Found"<<amountRead<<"\n";
			isSame = false;
			break;
		}
		isSame = (*it) == buffer;

	}

	inputDecoder.Assign(NULL);
	inputFile.CloseFile();

	if(!isSame)
	{
		cout<<"Read failes. different characters than what expected\n";
		return 1;
	}
	else
		return 0;

}